

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AppendOSXVerFlag
          (cmCommonTargetGenerator *this,string *flags,string *lang,char *name,bool so)

{
  cmLocalCommonGenerator *pcVar1;
  bool bVar2;
  char *__s;
  string *psVar3;
  ostream *poVar4;
  string local_318 [32];
  undefined1 local_2f8 [8];
  ostringstream vflag;
  allocator<char> local_179;
  undefined1 local_178 [8];
  string fallback_prop;
  cmAlphaNum local_128;
  undefined1 local_f8 [8];
  string prop;
  int local_d0;
  int patch;
  int minor;
  int major;
  cmValue local_b8;
  cmValue flag;
  cmAlphaNum local_80;
  undefined1 local_50 [8];
  string fvar;
  char *pcStack_28;
  bool so_local;
  char *name_local;
  string *lang_local;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  fvar.field_2._M_local_buf[0xf] = so;
  pcStack_28 = name;
  name_local = (char *)lang;
  lang_local = flags;
  flags_local = (string *)this;
  cmAlphaNum::cmAlphaNum(&local_80,"CMAKE_");
  cmAlphaNum::cmAlphaNum((cmAlphaNum *)&flag,(string *)name_local);
  cmStrCat<char[6],char_const*,char[14]>
            ((string *)local_50,&local_80,(cmAlphaNum *)&flag,(char (*) [6])"_OSX_",
             &stack0xffffffffffffffd8,(char (*) [14])"_VERSION_FLAG");
  local_b8 = cmMakefile::GetDefinition(this->Makefile,(string *)local_50);
  bVar2 = cmValue::operator_cast_to_bool(&local_b8);
  if (bVar2) {
    cmAlphaNum::cmAlphaNum(&local_128,"MACHO_");
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fallback_prop.field_2 + 8),pcStack_28);
    cmStrCat<char[9]>((string *)local_f8,&local_128,(cmAlphaNum *)((long)&fallback_prop.field_2 + 8)
                      ,(char (*) [9])0xbc168e);
    __s = "VERSION";
    if ((fvar.field_2._M_local_buf[0xf] & 1U) != 0) {
      __s = "SOVERSION";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_178,__s,&local_179);
    std::allocator<char>::~allocator(&local_179);
    cmGeneratorTarget::GetTargetVersionFallback
              (this->GeneratorTarget,(string *)local_f8,(string *)local_178,&patch,&local_d0,
               (int *)(prop.field_2._M_local_buf + 0xc));
    if (((0 < patch) || (0 < local_d0)) || (0 < (int)prop.field_2._12_4_)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f8);
      psVar3 = cmValue::operator*[abi_cxx11_(&local_b8);
      poVar4 = std::operator<<((ostream *)local_2f8,(string *)psVar3);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,patch);
      poVar4 = std::operator<<(poVar4,".");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_d0);
      poVar4 = std::operator<<(poVar4,".");
      std::ostream::operator<<(poVar4,prop.field_2._12_4_);
      psVar3 = lang_local;
      pcVar1 = this->LocalCommonGenerator;
      std::__cxx11::ostringstream::str();
      (*(pcVar1->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])(pcVar1,psVar3,local_318);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f8);
    }
    std::__cxx11::string::~string((string *)local_178);
    std::__cxx11::string::~string((string *)local_f8);
    minor = 0;
  }
  else {
    minor = 1;
  }
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void cmCommonTargetGenerator::AppendOSXVerFlag(std::string& flags,
                                               const std::string& lang,
                                               const char* name, bool so)
{
  // Lookup the flag to specify the version.
  std::string fvar = cmStrCat("CMAKE_", lang, "_OSX_", name, "_VERSION_FLAG");
  cmValue flag = this->Makefile->GetDefinition(fvar);

  // Skip if no such flag.
  if (!flag) {
    return;
  }

  // Lookup the target version information.
  int major;
  int minor;
  int patch;
  std::string prop = cmStrCat("MACHO_", name, "_VERSION");
  std::string fallback_prop = so ? "SOVERSION" : "VERSION";
  this->GeneratorTarget->GetTargetVersionFallback(prop, fallback_prop, major,
                                                  minor, patch);
  if (major > 0 || minor > 0 || patch > 0) {
    // Append the flag since a non-zero version is specified.
    std::ostringstream vflag;
    vflag << *flag << major << "." << minor << "." << patch;
    this->LocalCommonGenerator->AppendFlags(flags, vflag.str());
  }
}